

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O2

void parse<TopologyCommand>(string *query_text)

{
  Command cmd;
  ExprLhs<bool> local_109;
  AssertionHandler local_108;
  _Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  local_c0;
  
  parse_command((Command *)&local_c0,(string *)query_text);
  local_108.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_108.m_assertionInfo.macroName.m_size = 7;
  local_108.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/Tests.cpp";
  local_108.m_assertionInfo.lineInfo.line = 0x2a;
  local_108.m_assertionInfo.capturedExpression.m_start = "std::holds_alternative<T>(cmd)";
  local_108.m_assertionInfo.capturedExpression.m_size = 0x1e;
  local_108.m_assertionInfo.resultDisposition = Normal;
  local_108.m_reaction.shouldDebugBreak = false;
  local_108.m_reaction.shouldThrow = false;
  local_108.m_completed = false;
  local_108.m_resultCapture = Catch::getResultCapture();
  local_109.m_lhs = local_c0._M_index == '\t';
  Catch::AssertionHandler::handleExpr<bool>(&local_108,&local_109);
  Catch::AssertionHandler::complete(&local_108);
  Catch::AssertionHandler::~AssertionHandler(&local_108);
  std::
  get<9ul,SelectCommand,IndexCommand,IndexFromCommand,IteratorPopCommand,ReindexCommand,CompactCommand,ConfigGetCommand,ConfigSetCommand,StatusCommand,TopologyCommand,PingCommand,TaintCommand,DatasetDropCommand>
            ((variant<SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
              *)&local_c0);
  Catch::clara::std::__detail::__variant::
  _Variant_storage<false,_SelectCommand,_IndexCommand,_IndexFromCommand,_IteratorPopCommand,_ReindexCommand,_CompactCommand,_ConfigGetCommand,_ConfigSetCommand,_StatusCommand,_TopologyCommand,_PingCommand,_TaintCommand,_DatasetDropCommand>
  ::~_Variant_storage(&local_c0);
  return;
}

Assistant:

T parse(const std::string &query_text) {
    Command cmd = parse_command(query_text);
    REQUIRE(std::holds_alternative<T>(cmd));
    return std::move(std::get<T>(cmd));
}